

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMDocumentImpl::callUserDataHandlers
          (DOMDocumentImpl *this,DOMNodeImpl *n,DOMOperationType operation,DOMNode *src,DOMNode *dst
          )

{
  uint id;
  DOMUserDataHandler *pDVar1;
  void *pvVar2;
  int iVar3;
  undefined4 extraout_var;
  uint *puVar4;
  KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *pKVar5;
  XMLCh *pXVar6;
  int key2;
  ValueVectorEnumerator<int> snapshotEnum;
  ValueVectorOf<int> local_90;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  userDataEnum;
  
  if (this->fUserDataTable !=
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::RefHash2KeysTableOfEnumerator(&userDataEnum,this->fUserDataTable,false,this->fMemoryManager);
    userDataEnum.fLockPrimaryKey = n;
    (*userDataEnum.
      super_XMLEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>.
      _vptr_XMLEnumerator[4])(&userDataEnum);
    local_90.fMemoryManager = this->fMemoryManager;
    local_90.fCallDestructor = false;
    local_90.fCurCount = 0;
    local_90.fMaxCount = 3;
    iVar3 = (*(local_90.fMemoryManager)->_vptr_MemoryManager[3])(local_90.fMemoryManager,0xc);
    local_90.fElemList = (int *)CONCAT44(extraout_var,iVar3);
    snapshotEnum.fToEnum = &local_90;
    local_90.fElemList[2] = 0;
    local_90.fElemList[0] = 0;
    local_90.fElemList[1] = 0;
    while ((userDataEnum.fCurElem !=
            (RefHash2KeysTableBucketElem<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>_>
             *)0x0 || (userDataEnum.fCurHash != (userDataEnum.fToEnum)->fHashModulus))) {
      RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
      ::nextElementKey(&userDataEnum,(void **)&snapshotEnum,&key2);
      ValueVectorOf<int>::addElement(snapshotEnum.fToEnum,&key2);
    }
    snapshotEnum.super_XMLEnumerator<int>._vptr_XMLEnumerator =
         (_func_int **)&PTR__ValueVectorEnumerator_003fd058;
    snapshotEnum.fAdopted = false;
    snapshotEnum.fCurIndex = 0;
    while (snapshotEnum.fCurIndex < (snapshotEnum.fToEnum)->fCurCount) {
      puVar4 = (uint *)ValueVectorEnumerator<int>::nextElement(&snapshotEnum);
      id = *puVar4;
      pKVar5 = RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
               ::get(this->fUserDataTable,n,id);
      pDVar1 = pKVar5->fValue;
      if (pDVar1 != (DOMUserDataHandler *)0x0) {
        pvVar2 = pKVar5->fKey;
        pXVar6 = XMLStringPool::getValueForId(&this->fUserDataTableKeys,id);
        (**(code **)(*(long *)pDVar1 + 0x10))(pDVar1,operation,pXVar6,pvVar2,src,dst);
      }
    }
    if (operation == NODE_DELETED) {
      RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
      ::removeKey(this->fUserDataTable,n);
    }
    ValueVectorEnumerator<int>::~ValueVectorEnumerator(&snapshotEnum);
    ValueVectorOf<int>::~ValueVectorOf(&local_90);
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::~RefHash2KeysTableOfEnumerator(&userDataEnum);
  }
  return;
}

Assistant:

void DOMDocumentImpl::callUserDataHandlers(const DOMNodeImpl* n, DOMUserDataHandler::DOMOperationType operation, const DOMNode* src, DOMNode* dst) const
{
    if (fUserDataTable) {
        RefHash2KeysTableOfEnumerator<DOMUserDataRecord, PtrHasher> userDataEnum(fUserDataTable, false, fMemoryManager);
        userDataEnum.setPrimaryKey(n);
        // Create a snapshot of the handlers to be called, as the "handle" callback could be invalidating the enumerator by calling
        // setUserData on the dst node
        ValueVectorOf< int > snapshot(3, fMemoryManager);
        while (userDataEnum.hasMoreElements()) {
            // get the key
            void* key;
            int key2;
            userDataEnum.nextElementKey(key,key2);
            snapshot.addElement(key2);
        }
        ValueVectorEnumerator< int > snapshotEnum(&snapshot);
        while(snapshotEnum.hasMoreElements())
        {
            int key2=snapshotEnum.nextElement();

            // get the DOMUserDataRecord
            DOMUserDataRecord* userDataRecord = fUserDataTable->get((void*)n,key2);

            // get the handler
            DOMUserDataHandler* handler = userDataRecord->getValue();

            if (handler) {
                // get the data
                void* data = userDataRecord->getKey();
                const XMLCh* userKey = fUserDataTableKeys.getValueForId(key2);
                handler->handle(operation, userKey, data, src, dst);
            }
        }
        // if the operation is NODE_DELETED, we in fact should remove the data from the table
        if (operation == DOMUserDataHandler::NODE_DELETED)
            fUserDataTable->removeKey((void*)n);
    }
}